

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O2

void screen_byte_2(ubyte iobyte,uint address)

{
  ushort uVar1;
  uint i1;
  uint uVar2;
  uint cord;
  uint i1_00;
  uint i1_01;
  ushort uVar3;
  undefined7 in_register_00000039;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  
  uVar5 = address - ram_screen_start ^ 0x8000;
  if (screen_start <= address) {
    uVar5 = address;
  }
  uVar5 = uVar5 - screen_start;
  uVar1 = (ushort)((uint)uVar5 % ((uint)crt_regs[1] * 8));
  uVar4 = (uVar5 & 7) + (short)((uint)uVar5 / ((uint)crt_regs[1] * 8)) * 8;
  uVar2 = (uint)CONCAT71(in_register_00000039,iobyte);
  i1 = uVar2 & 0xffffff88;
  if ((iobyte & 0x88) != 0) {
    if (i1 == 0x88) {
      i1 = 10;
    }
    else if (i1 == 0x80) {
      i1 = 8;
    }
    else {
      i1 = 2;
    }
  }
  i1_00 = uVar2 & 0x44;
  if ((iobyte & 0x44) != 0) {
    if (i1_00 == 0x44) {
      i1_00 = 10;
    }
    else if (i1_00 == 0x40) {
      i1_00 = 8;
    }
    else {
      i1_00 = 2;
    }
  }
  i1_01 = uVar2 & 0x22;
  if (((iobyte & 0x22) != 0) && (i1_01 != 2)) {
    if (i1_01 == 0x22) {
      i1_01 = 10;
    }
    else {
      i1_01 = 8;
    }
  }
  cord = (uVar4 >> 2) + uVar4;
  uVar2 = uVar2 & 0x11;
  if ((iobyte & 0x11) != 0) {
    if (uVar2 == 0x11) {
      uVar2 = 10;
    }
    else if (uVar2 == 0x10) {
      uVar2 = 8;
    }
    else {
      uVar2 = 2;
    }
  }
  if (crt_regs[1] == 'P') {
    uVar3 = uVar1 & 0x7f8;
    uVar4 = uVar1 & 0x3f8;
    putpixel(uVar3,cord,i1);
    putpixel(uVar4 + 1,cord,i1);
    putpixel(uVar4 + 2,cord,i1_00);
    putpixel(uVar4 + 3,cord,i1_00);
    putpixel(uVar4 + 4,cord,i1_01);
    putpixel(uVar4 + 5,cord,i1_01);
    putpixel(uVar4 | 6,cord,uVar2);
    uVar4 = uVar1 | 7;
    putpixel(uVar1 | 7,cord,uVar2);
    if ((uVar5 & 3) != 0) {
      return;
    }
    uVar6 = cord - 1;
    putpixel(uVar3,uVar6,i1);
    putpixel(uVar3 | 1,uVar6,i1);
    putpixel(uVar3 | 2,uVar6,i1_00);
    putpixel(uVar3 | 3,uVar6,i1_00);
    putpixel(uVar3 | 4,uVar6,i1_01);
    putpixel(uVar3 | 5,uVar6,i1_01);
    putpixel(uVar3 | 6,uVar6,uVar2);
  }
  else {
    uVar1 = uVar1 * 2;
    uVar3 = uVar1 & 0xff0;
    putpixel(uVar3,cord,i1);
    putpixel(uVar3 + 1,cord,i1);
    putpixel(uVar3 + 2,cord,i1);
    putpixel(uVar3 + 3,cord,i1);
    putpixel(uVar3 + 4,cord,i1_00);
    putpixel(uVar3 + 5,cord,i1_00);
    putpixel(uVar3 + 6,cord,i1_00);
    putpixel(uVar3 + 7,cord,i1_00);
    putpixel(uVar3 + 8,cord,i1_01);
    putpixel(uVar3 + 9,cord,i1_01);
    putpixel(uVar3 + 10,cord,i1_01);
    putpixel(uVar3 + 0xb,cord,i1_01);
    putpixel(uVar3 + 0xc,cord,uVar2);
    putpixel(uVar3 + 0xd,cord,uVar2);
    putpixel(uVar1 | 0xe,cord,uVar2);
    uVar4 = uVar1 | 0xf;
    putpixel(uVar4,cord,uVar2);
    if ((uVar5 & 3) != 0) {
      return;
    }
    uVar6 = cord - 1;
    putpixel(uVar3,uVar6,i1);
    putpixel(uVar3 + 1,uVar6,i1);
    putpixel(uVar3 + 2,uVar6,i1);
    putpixel(uVar3 + 3,uVar6,i1);
    putpixel(uVar3 + 4,uVar6,i1_00);
    putpixel(uVar3 + 5,uVar6,i1_00);
    putpixel(uVar3 + 6,uVar6,i1_00);
    putpixel(uVar3 + 7,uVar6,i1_00);
    putpixel(uVar3 + 8,uVar6,i1_01);
    putpixel(uVar3 + 9,uVar6,i1_01);
    putpixel(uVar3 + 10,uVar6,i1_01);
    putpixel(uVar3 + 0xb,uVar6,i1_01);
    putpixel(uVar3 + 0xc,uVar6,uVar2);
    putpixel(uVar3 + 0xd,uVar6,uVar2);
    putpixel(uVar1 | 0xe,uVar6,uVar2);
  }
  putpixel(uVar4,cord - 1,uVar2);
  return;
}

Assistant:

void screen_byte_2(ubyte iobyte, uint address) {
    uint x_cord = 0;         // general x coordinate variable
    uint y_cord = 0;         // general y coordinate variable
    uint virt_y_cord = 0;    // vertically scaled pc y coordinate
    uint bitsperline;      // bits per line variable
    ubyte colpix1;         // colour of pixel 1
    ubyte colpix2;         // colour of pixel 2
    ubyte colpix3;         // colour of pixel 3
    ubyte colpix4;         // colour of pixel 4

    // deal with hardware wraparound
    if (address < screen_start) address += (0x8000 - ram_screen_start);
    address -= screen_start;

    bitsperline = 8 * crt_regs[1];  // calculate bits per scanline

    y_cord = address / bitsperline; // calculate character row
    y_cord *= 8;                  // convert to pixel row
    y_cord += (address % 8);        // add fraction of character offset

    virt_y_cord += y_cord + y_cord / 4; // scale output to fit pc screen

    x_cord = address % bitsperline;  // calculate x character column
    x_cord &= 0xFFF8;              // mask off lower 3 bits

    switch (iobyte & 0x88)                // calculate colour of pixel 1
    {
        case 0x00:
            colpix1 = 0x00;
            break;
        case 0x08:
            colpix1 = 0x02;
            break;
        case 0x80:
            colpix1 = 0x08;
            break;
        case 0x88:
            colpix1 = 0x0A;
            break;
    }

    switch (iobyte & 0x44)                // calculate colour of pixel 2
    {
        case 0x00:
            colpix2 = 0x00;
            break;
        case 0x04:
            colpix2 = 0x02;
            break;
        case 0x40:
            colpix2 = 0x08;
            break;
        case 0x44:
            colpix2 = 0x0A;
            break;
    }

    switch (iobyte & 0x22)                // calculate colour of pixel 3
    {
        case 0x00:
            colpix3 = 0x00;
            break;
        case 0x02:
            colpix3 = 0x02;
            break;
        case 0x20:
            colpix3 = 0x08;
            break;
        case 0x22:
            colpix3 = 0x0A;
            break;
    }

    switch (iobyte & 0x11)                // calcalate colour of pixel 4
    {
        case 0x00:
            colpix4 = 0x00;
            break;
        case 0x01:
            colpix4 = 0x02;
            break;
        case 0x10:
            colpix4 = 0x08;
            break;
        case 0x11:
            colpix4 = 0x0A;
            break;
    }


    if (bitsperline == 640)              // if this is a 40 character mode
    {
        putpixel(x_cord + 0, virt_y_cord, colpix1);
        putpixel(x_cord + 1, virt_y_cord, colpix1);
        putpixel(x_cord + 2, virt_y_cord, colpix2);
        putpixel(x_cord + 3, virt_y_cord, colpix2);
        putpixel(x_cord + 4, virt_y_cord, colpix3);
        putpixel(x_cord + 5, virt_y_cord, colpix3);
        putpixel(x_cord + 6, virt_y_cord, colpix4);
        putpixel(x_cord + 7, virt_y_cord, colpix4);
    }
    else                               // if this is not a 40 character mode
    {
        x_cord <<= 1;                        // scale the x coorinate to fit the scren
        putpixel(x_cord + 0, virt_y_cord, colpix1);
        putpixel(x_cord + 1, virt_y_cord, colpix1);
        putpixel(x_cord + 2, virt_y_cord, colpix1);
        putpixel(x_cord + 3, virt_y_cord, colpix1);
        putpixel(x_cord + 4, virt_y_cord, colpix2);
        putpixel(x_cord + 5, virt_y_cord, colpix2);
        putpixel(x_cord + 6, virt_y_cord, colpix2);
        putpixel(x_cord + 7, virt_y_cord, colpix2);
        putpixel(x_cord + 8, virt_y_cord, colpix3);
        putpixel(x_cord + 9, virt_y_cord, colpix3);
        putpixel(x_cord + 10, virt_y_cord, colpix3);
        putpixel(x_cord + 11, virt_y_cord, colpix3);
        putpixel(x_cord + 12, virt_y_cord, colpix4);
        putpixel(x_cord + 13, virt_y_cord, colpix4);
        putpixel(x_cord + 14, virt_y_cord, colpix4);
        putpixel(x_cord + 15, virt_y_cord, colpix4);
    }

    if (!(y_cord & 3))                      // if the y coordinate was scaled,
    {
        virt_y_cord--;                        // put the pixels on the original line

        if (bitsperline == 640)                 // if this is a 40 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, colpix1);
            putpixel(x_cord + 1, virt_y_cord, colpix1);
            putpixel(x_cord + 2, virt_y_cord, colpix2);
            putpixel(x_cord + 3, virt_y_cord, colpix2);
            putpixel(x_cord + 4, virt_y_cord, colpix3);
            putpixel(x_cord + 5, virt_y_cord, colpix3);
            putpixel(x_cord + 6, virt_y_cord, colpix4);
            putpixel(x_cord + 7, virt_y_cord, colpix4);
        }
        else                                  // if this is not a 40 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, colpix1);
            putpixel(x_cord + 1, virt_y_cord, colpix1);
            putpixel(x_cord + 2, virt_y_cord, colpix1);
            putpixel(x_cord + 3, virt_y_cord, colpix1);
            putpixel(x_cord + 4, virt_y_cord, colpix2);
            putpixel(x_cord + 5, virt_y_cord, colpix2);
            putpixel(x_cord + 6, virt_y_cord, colpix2);
            putpixel(x_cord + 7, virt_y_cord, colpix2);
            putpixel(x_cord + 8, virt_y_cord, colpix3);
            putpixel(x_cord + 9, virt_y_cord, colpix3);
            putpixel(x_cord + 10, virt_y_cord, colpix3);
            putpixel(x_cord + 11, virt_y_cord, colpix3);
            putpixel(x_cord + 12, virt_y_cord, colpix4);
            putpixel(x_cord + 13, virt_y_cord, colpix4);
            putpixel(x_cord + 14, virt_y_cord, colpix4);
            putpixel(x_cord + 15, virt_y_cord, colpix4);
        }

    }

}